

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_21::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  ostream *poVar1;
  size_t sVar2;
  char local_11;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_11,1);
  if (this == (PosixColourImpl *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)this,sVar2);
  }
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            std::cout << '\033' << _escapeCode;
        }